

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O3

void __thiscall NPC::Spawn(NPC *this,NPC *parent)

{
  short sVar1;
  pointer ppNVar2;
  NPC *this_00;
  Character *this_01;
  bool bVar3;
  int iVar4;
  ENF_Data *pEVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  pointer ppNVar11;
  list<Character_*,_std::allocator<Character_*>_> *plVar12;
  _List_node_base *p_Var13;
  double dVar14;
  PacketBuilder builder;
  PacketBuilder local_60;
  
  if (this->alive != false) {
    return;
  }
  pEVar5 = ENF(this);
  if ((parent == (NPC *)0x0) && (pEVar5->boss != 0)) {
    ppNVar11 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppNVar2 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppNVar11 == ppNVar2) goto LAB_0016427a;
    do {
      this_00 = *ppNVar11;
      pEVar5 = ENF(this_00);
      if (pEVar5->child != 0) {
        Spawn(this_00,this);
      }
      ppNVar11 = ppNVar11 + 1;
    } while (ppNVar11 != ppNVar2);
  }
  if (parent != (NPC *)0x0) {
    this->parent = parent;
  }
LAB_0016427a:
  if (this->spawn_type < 7) {
    uVar8 = 0;
    do {
      if ((uVar8 == 0) && (this->temporary != false)) {
        this->x = this->spawn_x;
        this->y = this->spawn_y;
        bVar3 = Map::Walkable(this->map,this->spawn_x,this->spawn_y,true);
        if (bVar3) {
LAB_001642f6:
          bVar3 = Map::Occupied(this->map,this->x,this->y,NPCOnly,false);
          if (!bVar3) goto LAB_00164388;
        }
      }
      else {
        iVar4 = util::rand();
        this->x = (uchar)iVar4;
        iVar4 = util::rand();
        this->y = (uchar)iVar4;
        bVar3 = Map::Walkable(this->map,this->x,(uchar)iVar4,true);
        if (bVar3) {
          if (uVar8 < 0x65) goto LAB_001642f6;
LAB_00164388:
          iVar4 = util::rand();
          this->direction = (Direction)iVar4;
          goto LAB_0016441c;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 200);
    sVar1 = this->map->id;
    bVar9 = this->spawn_x;
    bVar6 = this->spawn_y;
    pEVar5 = ::ENF::Get(this->map->world->enf,this->id);
    Console::Wrn("An NPC on map %i at %i,%i is being placed by linear scan of spawn area (%s)",
                 (ulong)(uint)(int)sVar1,(ulong)bVar9,(ulong)bVar6,(pEVar5->name)._M_dataplus._M_p);
    bVar9 = this->spawn_x;
    uVar8 = (uint)bVar9;
    bVar6 = bVar9 - 2;
    this->x = bVar6;
    if ((uint)bVar6 <= bVar9 + 2) {
      uVar7 = (uint)this->spawn_y;
      do {
        uVar10 = uVar7 - 2;
        this->y = (uchar)uVar10;
        if ((uVar10 & 0xff) <= uVar7 + 2) {
          do {
            bVar3 = Map::Walkable(this->map,this->x,(uchar)uVar10,true);
            if (bVar3) {
              Console::Wrn("Placed at valid location: %i,%i",(ulong)this->x,(ulong)this->y);
              goto LAB_0016441c;
            }
            bVar9 = this->y + 1;
            uVar10 = (uint)bVar9;
            this->y = bVar9;
            uVar7 = (uint)this->spawn_y;
          } while ((uint)bVar9 <= this->spawn_y + 2);
          bVar6 = this->x;
          uVar8 = (uint)this->spawn_x;
        }
        bVar6 = bVar6 + 1;
        this->x = bVar6;
      } while ((uint)bVar6 <= uVar8 + 2);
    }
    Console::Err("NPC couldn\'t spawn anywhere valid!");
  }
LAB_0016441c:
  this->alive = true;
  pEVar5 = ENF(this);
  this->hp = pEVar5->hp;
  dVar14 = Timer::GetTime();
  this->last_act = dVar14;
  this->act_speed = speed_table[this->spawn_type];
  PacketBuilder::PacketBuilder(&local_60,PACKET_APPEAR,PACKET_REPLY,8);
  PacketBuilder::AddChar(&local_60,'\0');
  PacketBuilder::AddByte(&local_60,0xff);
  PacketBuilder::AddChar(&local_60,this->index);
  PacketBuilder::AddShort(&local_60,(unsigned_short)this->id);
  PacketBuilder::AddChar(&local_60,this->x);
  PacketBuilder::AddChar(&local_60,this->y);
  PacketBuilder::AddChar(&local_60,this->direction);
  p_Var13 = (this->map->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  plVar12 = &this->map->characters;
  if (p_Var13 != (_List_node_base *)plVar12) {
    do {
      this_01 = (Character *)p_Var13[1]._M_next;
      if ((this_01->nowhere == false) &&
         (bVar3 = Character::InRange(this_01,this->x,this->y), bVar3)) {
        EOClient::Send(this_01->player->client,&local_60);
      }
      p_Var13 = p_Var13->_M_next;
    } while (p_Var13 != (_List_node_base *)plVar12);
  }
  PacketBuilder::~PacketBuilder(&local_60);
  return;
}

Assistant:

void NPC::Spawn(NPC *parent)
{
	if (this->alive)
		return;

	if (this->ENF().boss && !parent)
	{
		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().child)
			{
				npc->Spawn(this);
			}
		}
	}

	if (parent)
	{
		this->parent = parent;
	}

	if (this->spawn_type < 7)
	{
		bool found = false;
		for (int i = 0; i < 200; ++i)
		{
			if (this->temporary && i == 0)
			{
				this->x = this->spawn_x;
				this->y = this->spawn_y;
			}
			else
			{
				this->x = util::rand(this->spawn_x-2, this->spawn_x+2);
				this->y = util::rand(this->spawn_y-2, this->spawn_y+2);
			}

			if (this->map->Walkable(this->x, this->y, true) && (i > 100 || !this->map->Occupied(this->x, this->y, Map::NPCOnly)))
			{
				this->direction = static_cast<Direction>(util::rand(0,3));
				found = true;
				break;
			}
		}

		if (!found)
		{
			Console::Wrn("An NPC on map %i at %i,%i is being placed by linear scan of spawn area (%s)", this->map->id, this->spawn_x, this->spawn_y, this->map->world->enf->Get(this->id).name.c_str());
			for (this->x = this->spawn_x-2; this->x <= spawn_x+2; ++this->x)
			{
				for (this->y = this->spawn_y-2; this->y <= this->spawn_y+2; ++this->y)
				{
					if (this->map->Walkable(this->x, this->y, true))
					{
						Console::Wrn("Placed at valid location: %i,%i", this->x, this->y);
						found = true;
						goto end_linear_scan;
					}
				}
			}
		}
		end_linear_scan:

		if (!found)
		{
			Console::Err("NPC couldn't spawn anywhere valid!");
		}
	}

	this->alive = true;
	this->hp = this->ENF().hp;
	this->last_act = Timer::GetTime();
	this->act_speed = speed_table[this->spawn_type];

	PacketBuilder builder(PACKET_APPEAR, PACKET_REPLY, 8);
	builder.AddChar(0);
	builder.AddByte(255);
	builder.AddChar(this->index);
	builder.AddShort(this->id);
	builder.AddChar(this->x);
	builder.AddChar(this->y);
	builder.AddChar(this->direction);

	UTIL_FOREACH(this->map->characters, character)
	{
		if (character->InRange(this))
		{
			character->Send(builder);
		}
	}
}